

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMaterialShellReissner::ChMaterialShellReissner
          (ChMaterialShellReissner *this,shared_ptr<chrono::fea::ChElasticityReissner> *melasticity,
          shared_ptr<chrono::fea::ChPlasticityReissner> *mplasticity,
          shared_ptr<chrono::fea::ChDampingReissner> *mdamping)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->_vptr_ChMaterialShellReissner = (_func_int **)&PTR__ChMaterialShellReissner_00b53810;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->plasticity).
  super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->damping).super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (melasticity->
             super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_20._M_pi =
       (melasticity->
       super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  (this->elasticity).
  super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_28;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->elasticity).
              super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_20);
  ((this->elasticity).
   super___shared_ptr<chrono::fea::ChElasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  section = this;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  peVar1 = (mplasticity->
           super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    local_40._M_pi =
         (mplasticity->
         super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      }
    }
    (this->plasticity).
    super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->plasticity).
                super___shared_ptr<chrono::fea::ChPlasticityReissner,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_40);
    peVar1->section = this;
    if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
    }
  }
  local_38 = (mdamping->
             super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (local_38 != (element_type *)0x0) {
    local_30._M_pi =
         (mdamping->super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      }
    }
    (this->damping).super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_38;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->damping).
                super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_30);
    ((this->damping).super___shared_ptr<chrono::fea::ChDampingReissner,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->section = this;
    if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    }
  }
  return;
}

Assistant:

ChMaterialShellReissner::ChMaterialShellReissner(std::shared_ptr<ChElasticityReissner> melasticity,
											   std::shared_ptr<ChPlasticityReissner> mplasticity,
											   std::shared_ptr<ChDampingReissner>    mdamping) {
    this->SetElasticity(melasticity);

    if (mplasticity)
        this->SetPlasticity(mplasticity);

    if (mdamping)
        this->SetDamping(mdamping);
}